

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_save_generated_parameter(HTS_Engine *engine,size_t stream_index,FILE *fp)

{
  ulong uVar1;
  HTS_GStreamSet *gss_00;
  size_t sVar2;
  FILE *in_RDX;
  size_t in_RSI;
  long in_RDI;
  double dVar3;
  HTS_GStreamSet *gss;
  float temp;
  size_t j;
  size_t i;
  float local_2c;
  ulong local_28;
  ulong local_20;
  FILE *local_18;
  size_t local_10;
  
  gss_00 = (HTS_GStreamSet *)(in_RDI + 0x180);
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    uVar1 = local_20;
    sVar2 = HTS_GStreamSet_get_total_frame(gss_00);
    if (sVar2 <= uVar1) break;
    local_28 = 0;
    while( true ) {
      uVar1 = local_28;
      sVar2 = HTS_GStreamSet_get_vector_length(gss_00,local_10);
      if (sVar2 <= uVar1) break;
      dVar3 = HTS_GStreamSet_get_parameter(gss_00,local_10,local_20,local_28);
      local_2c = (float)dVar3;
      fwrite(&local_2c,4,1,local_18);
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void HTS_Engine_save_generated_parameter(HTS_Engine * engine, size_t stream_index, FILE * fp)
{
   size_t i, j;
   float temp;
   HTS_GStreamSet *gss = &engine->gss;

   for (i = 0; i < HTS_GStreamSet_get_total_frame(gss); i++)
      for (j = 0; j < HTS_GStreamSet_get_vector_length(gss, stream_index); j++) {
         temp = (float) HTS_GStreamSet_get_parameter(gss, stream_index, i, j);
         fwrite(&temp, sizeof(float), 1, fp);
      }
}